

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

void helics::generateMinTimeImplementation
               (TimeData *mTime,DependencyInfo *dep,GlobalFederateId ignore,int32_t sequenceCode)

{
  TimeState TVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  baseType bVar9;
  
  TVar1 = (dep->super_TimeData).mTimeState;
  iVar3 = (dep->fedID).gid;
  if (TVar1 < time_granted) {
    if (iVar3 == ignore.gid) {
      return;
    }
    if (TVar1 < mTime->mTimeState) {
      (mTime->minFed).gid = iVar3;
      mTime->mTimeState = TVar1;
      mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
      mTime->restrictionLevel = (dep->super_TimeData).restrictionLevel;
      iVar4 = (dep->super_TimeData).responseSequenceCounter;
      mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
      mTime->responseSequenceCounter = iVar4;
    }
    else {
      if (TVar1 != mTime->mTimeState) goto LAB_003661cb;
      bVar2 = (dep->super_TimeData).restrictionLevel;
      if (mTime->restrictionLevel <= bVar2) {
        if (bVar2 == mTime->restrictionLevel) {
          bVar7 = (dep->super_TimeData).interrupted;
          if (bVar7 == mTime->interrupted) {
            if (iVar3 < (mTime->minFed).gid) {
              (mTime->minFed).gid = iVar3;
              mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
              iVar4 = (dep->super_TimeData).sequenceCounter;
              mTime->sequenceCounter = iVar4;
              mTime->responseSequenceCounter = iVar4;
            }
          }
          else if (bVar7 == false) {
            (mTime->minFed).gid = iVar3;
            mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
            mTime->restrictionLevel = bVar2;
            iVar4 = (dep->super_TimeData).sequenceCounter;
            mTime->sequenceCounter = iVar4;
            mTime->responseSequenceCounter = iVar4;
            mTime->interrupted = false;
          }
        }
        goto LAB_003661cb;
      }
      (mTime->minFed).gid = iVar3;
      mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
      mTime->restrictionLevel = bVar2;
      iVar4 = (dep->super_TimeData).sequenceCounter;
      mTime->sequenceCounter = iVar4;
      mTime->responseSequenceCounter = iVar4;
    }
    mTime->interrupted = (dep->super_TimeData).interrupted;
LAB_003661cb:
    (mTime->next).internalTimeCode = -1;
    (mTime->Te).internalTimeCode = 0;
    (mTime->minDe).internalTimeCode = 0;
    return;
  }
  if (iVar3 == ignore.gid) {
    if (ignore.gid < 0x70000000 && ignore.gid != 1) {
      return;
    }
    lVar5 = (dep->super_TimeData).Te.internalTimeCode;
    if ((mTime->minDe).internalTimeCode <= lVar5) {
      return;
    }
    (mTime->minDe).internalTimeCode = lVar5;
    return;
  }
  if (dep->connection == SELF) {
    iVar8 = (dep->super_TimeData).responseSequenceCounter;
LAB_00366079:
    if ((iVar8 == sequenceCode) && (dep->dependent == true)) {
      lVar5 = (dep->super_TimeData).minDe.internalTimeCode;
      iVar8 = sequenceCode;
      if (((dep->super_TimeData).next.internalTimeCode <= lVar5) &&
         (lVar5 < (mTime->minDe).internalTimeCode)) {
        (mTime->minDe).internalTimeCode = lVar5;
      }
    }
    else {
      bVar9 = (dep->super_TimeData).next.internalTimeCode;
LAB_003660f3:
      if (bVar9 < (mTime->minDe).internalTimeCode) {
        (mTime->minDe).internalTimeCode = bVar9;
      }
    }
  }
  else {
    iVar8 = (dep->super_TimeData).responseSequenceCounter;
    if ((((sequenceCode != 0) && (iVar8 != sequenceCode)) &&
        ((dep->super_TimeData).timingVersion != '\0')) && (dep->dependent != false))
    goto LAB_00366079;
    bVar9 = (dep->super_TimeData).minDe.internalTimeCode;
    if ((dep->super_TimeData).next.internalTimeCode <= bVar9) goto LAB_003660f3;
    (mTime->minDe).internalTimeCode = -1000000000;
  }
  lVar5 = (dep->super_TimeData).next.internalTimeCode;
  lVar6 = (mTime->next).internalTimeCode;
  if (lVar5 < lVar6) {
    (mTime->next).internalTimeCode = lVar5;
    mTime->mTimeState = TVar1;
    if ((iVar8 != sequenceCode) || (dep->dependent != true)) goto LAB_0036615a;
    bVar7 = (dep->super_TimeData).interrupted;
  }
  else {
    if (lVar5 != lVar6) goto LAB_0036615f;
    if (TVar1 == time_granted) {
      mTime->mTimeState = time_granted;
    }
    else if ((dep->super_TimeData).interrupted != false) goto LAB_0036615f;
LAB_0036615a:
    bVar7 = false;
  }
  mTime->interrupted = bVar7;
LAB_0036615f:
  lVar5 = (dep->super_TimeData).Te.internalTimeCode;
  lVar6 = (mTime->Te).internalTimeCode;
  if (lVar6 <= lVar5) {
    if (lVar5 == lVar6) {
      (mTime->minFed).gid = -2010000000;
      (mTime->TeAlt).internalTimeCode = lVar5;
    }
    return;
  }
  (mTime->TeAlt).internalTimeCode = lVar6;
  (mTime->Te).internalTimeCode = (dep->super_TimeData).Te.internalTimeCode;
  (mTime->minFed).gid = iVar3;
  iVar4 = (dep->super_TimeData).sequenceCounter;
  mTime->sequenceCounter = iVar4;
  mTime->responseSequenceCounter = iVar4;
  iVar3 = (dep->super_TimeData).minFed.gid;
  if ((iVar3 != -2010000000) && (iVar3 != -1700000000)) {
    (mTime->minFedActual).gid = iVar3;
    return;
  }
  (mTime->minFed).gid = (dep->fedID).gid;
  return;
}

Assistant:

static void generateMinTimeImplementation(TimeData& mTime,
                                          const DependencyInfo& dep,
                                          GlobalFederateId ignore,
                                          std::int32_t sequenceCode)
{
    if (dep.mTimeState < TimeState::time_granted) {
        if (dep.fedID == ignore) {
            return;
        }
        if (dep.mTimeState < mTime.mTimeState) {
            mTime.minFed = dep.fedID;
            mTime.mTimeState = dep.mTimeState;
            mTime.delayedTiming = dep.delayedTiming;
            mTime.restrictionLevel = dep.restrictionLevel;
            mTime.sequenceCounter = dep.sequenceCounter;
            mTime.responseSequenceCounter = dep.responseSequenceCounter;
            mTime.interrupted = dep.interrupted;
        } else if (dep.mTimeState == mTime.mTimeState) {
            if (dep.restrictionLevel < mTime.restrictionLevel) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.restrictionLevel = dep.restrictionLevel;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
                mTime.interrupted = dep.interrupted;
            } else if (dep.restrictionLevel == mTime.restrictionLevel &&
                       dep.interrupted != mTime.interrupted) {
                if (!dep.interrupted) {
                    mTime.minFed = dep.fedID;
                    mTime.delayedTiming = dep.delayedTiming;
                    mTime.restrictionLevel = dep.restrictionLevel;
                    mTime.sequenceCounter = dep.sequenceCounter;
                    mTime.responseSequenceCounter = dep.sequenceCounter;
                    mTime.interrupted = false;
                }
            } else if (dep.restrictionLevel == mTime.restrictionLevel && dep.fedID < mTime.minFed) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
            }
        }
        mTime.next = initializationTime;
        mTime.Te = timeZero;
        mTime.minDe = timeZero;
        return;
    }

    if (dep.fedID == ignore) {
        if (dep.fedID.isBroker()) {
            if (dep.Te < mTime.minDe) {
                mTime.minDe = dep.Te;
            }
        }

        return;
    }

    if (dep.connection != ConnectionType::SELF &&
        (sequenceCode == 0 || dep.responseSequenceCounter == sequenceCode ||
         dep.timingVersion == 0 || !dep.dependent)) {
        if (dep.minDe >= dep.next) {
            if (dep.minDe < mTime.minDe) {
                mTime.minDe = dep.minDe;
            }
        } else {
            // this minimum dependent event time received was invalid and can't be trusted
            // therefore it can't be used to determine a time grant
            mTime.minDe = -1;
        }
    } else if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
        if (dep.minDe >= dep.next && dep.minDe < mTime.minDe) {
            mTime.minDe = dep.minDe;
        }
    } else {
        if (dep.next < mTime.minDe) {
            mTime.minDe = dep.next;
        }
    }
    if (dep.next < mTime.next) {
        mTime.next = dep.next;
        mTime.mTimeState = dep.mTimeState;
        if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
            mTime.interrupted = dep.interrupted;
        } else {
            mTime.interrupted = false;
        }
    } else if (dep.next == mTime.next) {
        if (dep.mTimeState == TimeState::time_granted) {
            mTime.mTimeState = dep.mTimeState;
            mTime.interrupted = false;
        } else if (!dep.interrupted) {
            mTime.interrupted = false;
        }
    }
    // if (dep.connection != ConnectionType::self) {
    if (dep.Te < mTime.Te) {
        mTime.TeAlt = mTime.Te;
        mTime.Te = dep.Te;
        mTime.minFed = dep.fedID;
        mTime.sequenceCounter = dep.sequenceCounter;
        mTime.responseSequenceCounter = dep.sequenceCounter;

        if (dep.minFed.isValid()) {
            mTime.minFedActual = dep.minFed;
        } else {
            mTime.minFed = dep.fedID;
        }
    } else if (dep.Te == mTime.Te) {
        mTime.minFed = GlobalFederateId{};
        mTime.TeAlt = mTime.Te;
    }
    // }
}